

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessRawPacket
          (RTPSources *this,RTPRawPacket *rawpack,RTPTransmitter *rtptrans,bool acceptownpackets)

{
  int iVar1;
  uint local_34;
  RTPTransmitter *pRStack_30;
  int num;
  RTPTransmitter *transmitters [1];
  bool acceptownpackets_local;
  RTPTransmitter *rtptrans_local;
  RTPRawPacket *rawpack_local;
  RTPSources *this_local;
  
  local_34 = (uint)(rtptrans != (RTPTransmitter *)0x0);
  pRStack_30 = rtptrans;
  transmitters[0]._7_1_ = acceptownpackets;
  iVar1 = ProcessRawPacket(this,rawpack,&stack0xffffffffffffffd0,local_34,acceptownpackets);
  return iVar1;
}

Assistant:

int RTPSources::ProcessRawPacket(RTPRawPacket *rawpack,RTPTransmitter *rtptrans,bool acceptownpackets)
{
	RTPTransmitter *transmitters[1];
	int num;
	
	transmitters[0] = rtptrans;
	if (rtptrans == 0)
		num = 0;
	else
		num = 1;
	return ProcessRawPacket(rawpack,transmitters,num,acceptownpackets);
}